

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void performace_test(void)

{
  FastQueue *this;
  int i_2;
  uint32_t *puVar1;
  int i;
  ulong uVar2;
  pthread_t *__newthread;
  pthread_t *__newthread_00;
  pthread_t consumer [32];
  pthread_t producer [32];
  
  __newthread_00 = consumer;
  this = (FastQueue *)operator_new(0xc0);
  FastQueue::FastQueue(this,0x10,0x10);
  fastqueue = this;
  start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  puVar1 = p;
  __newthread = producer;
  for (uVar2 = 0; uVar2 < producer_num; uVar2 = uVar2 + 1) {
    pthread_create(__newthread,(pthread_attr_t *)0x0,producer_fun,puVar1);
    puVar1 = puVar1 + 1;
    __newthread = __newthread + 1;
  }
  puVar1 = c;
  for (uVar2 = 0; uVar2 < consumer_num; uVar2 = uVar2 + 1) {
    pthread_create(__newthread_00,(pthread_attr_t *)0x0,consumer_fun,puVar1);
    puVar1 = puVar1 + 1;
    __newthread_00 = __newthread_00 + 1;
  }
  for (uVar2 = 0; uVar2 < producer_num; uVar2 = uVar2 + 1) {
    pthread_join(producer[uVar2],(void **)0x0);
  }
  for (uVar2 = 0; uVar2 < consumer_num; uVar2 = uVar2 + 1) {
    pthread_join(consumer[uVar2],(void **)0x0);
  }
  return;
}

Assistant:

void performace_test(){
     uint32_t  bucket_num = 16, pages_per_bucket = 10;
    pthread_t producer[32], consumer[32];
    
    
    fastqueue = new FastQueue(bucket_num, bucket_num);
    
    start = std::chrono::steady_clock::now();


    for(int i = 0; i < producer_num; ++i){
        pthread_create(&producer[i], NULL, producer_fun, &p[i]);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_create(&consumer[i], NULL, consumer_fun, &c[i]);
    }

    for(int i = 0; i < producer_num; ++i){
        pthread_join(producer[i], NULL);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_join(consumer[i], NULL);
    }


}